

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOperatorTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Performance::anon_unknown_1::OperatorPerformanceCase::OperatorPerformanceCase
          (OperatorPerformanceCase *this,TestContext *testCtx,RenderContext *renderCtx,char *name,
          char *description,CaseType caseType,int numWorkloads,
          InitialCalibrationStorage *initialCalibrationStorage)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CaseType CVar5;
  undefined4 in_register_0000008c;
  
  tcu::TestCase::TestCase
            (&this->super_TestCase,testCtx,NODETYPE_PERFORMANCE,name,
             glcts::fixed_sample_locations_values + 1);
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__OperatorPerformanceCase_02129ac8;
  this->m_renderCtx = renderCtx;
  CVar5 = (CaseType)description;
  this->m_caseType = CVar5;
  iVar3 = tcu::CommandLine::getTestIterationCount
                    (((this->super_TestCase).super_TestNode.m_testCtx)->m_cmdLine);
  iVar4 = 3;
  if (0 < iVar3) {
    iVar4 = iVar3;
  }
  this->m_numMeasurementsPerWorkload = iVar4;
  this->m_numWorkloads = 8;
  this->m_workloadNdx = -1;
  this->m_workloadMeasurementNdx = -1;
  (this->m_workloadRecordsFindHigh).
  super__Vector_base<std::vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_workloadRecordsFindHigh).
  super__Vector_base<std::vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_workloadRecordsFindHigh).
  super__Vector_base<std::vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_workloadRecords).
  super__Vector_base<std::vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_workloadRecords).
  super__Vector_base<std::vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_workloadRecords).
  super__Vector_base<std::vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_state = STATE_LAST;
  this->m_measureProgramNdx = -1;
  (this->m_highWorkloadSizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_highWorkloadSizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_highWorkloadSizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deqp::gls::TheilSenCalibrator::TheilSenCalibrator(&this->m_calibrator);
  pSVar2 = (SharedPtrStateBase *)((undefined8 *)CONCAT44(in_register_0000008c,caseType))[1];
  (this->m_initialCalibrationStorage).m_ptr =
       *(InitialCalibration **)CONCAT44(in_register_0000008c,caseType);
  (this->m_initialCalibrationStorage).m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_initialCalibrationStorage).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  if (CVar5 == CASETYPE_VERTEX) {
    this->m_viewportWidth = 0x20;
    iVar4 = 0x20;
  }
  else {
    iVar4 = (*renderCtx->_vptr_RenderContext[4])(renderCtx);
    this->m_viewportWidth = *(int *)CONCAT44(extraout_var,iVar4);
    iVar4 = (*renderCtx->_vptr_RenderContext[4])(renderCtx);
    iVar4 = *(int *)(CONCAT44(extraout_var_00,iVar4) + 4);
  }
  this->m_viewportHeight = iVar4;
  iVar4 = 100;
  if (CVar5 == CASETYPE_FRAGMENT) {
    iVar4 = 1;
  }
  this->m_gridSizeX = iVar4;
  this->m_gridSizeY = iVar4;
  (this->m_programData).
  super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_programData).
  super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_programData).
  super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_programs).
  super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_programs).
  super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_programs).
  super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_attribBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_attribBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_attribBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

OperatorPerformanceCase::OperatorPerformanceCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* name, const char* description,
												  CaseType caseType, int numWorkloads, const InitialCalibrationStorage& initialCalibrationStorage)
	: tcu::TestCase					(testCtx, tcu::NODETYPE_PERFORMANCE, name, description)
	, m_renderCtx					(renderCtx)
	, m_caseType					(caseType)
	, m_numMeasurementsPerWorkload	(getIterationCountOrDefault(m_testCtx.getCommandLine(), DEFAULT_NUM_MEASUREMENTS_PER_WORKLOAD))
	, m_numWorkloads				(numWorkloads)
	, m_workloadNdx					(-1)
	, m_workloadMeasurementNdx		(-1)
	, m_state						(STATE_LAST)
	, m_measureProgramNdx			(-1)
	, m_initialCalibrationStorage	(initialCalibrationStorage)
	, m_viewportWidth				(caseType == CASETYPE_VERTEX	? 32	: renderCtx.getRenderTarget().getWidth())
	, m_viewportHeight				(caseType == CASETYPE_VERTEX	? 32	: renderCtx.getRenderTarget().getHeight())
	, m_gridSizeX					(caseType == CASETYPE_FRAGMENT	? 1		: 100)
	, m_gridSizeY					(caseType == CASETYPE_FRAGMENT	? 1		: 100)
{
	DE_ASSERT(m_numWorkloads > 0);
}